

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall ADS::Graph<unsigned_int>::empty(Graph<unsigned_int> *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Edge<unsigned_int> *local_28;
  Edge<unsigned_int> *pEdge;
  Vertex<unsigned_int> *pVertex;
  uint i;
  Graph<unsigned_int> *this_local;
  Vertex<unsigned_int> *this_00;
  
  for (pVertex._4_4_ = 0; uVar1 = DArray<ADS::Vertex<unsigned_int>_*>::size(&this->_vertices),
      pVertex._4_4_ < uVar1; pVertex._4_4_ = pVertex._4_4_ + 1) {
    iVar2 = DArray<ADS::Vertex<unsigned_int>_*>::remove
                      (&this->_vertices,(char *)(ulong)pVertex._4_4_);
    this_00 = (Vertex<unsigned_int> *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (Vertex<unsigned_int> *)0x0) {
      local_28 = LChain<ADS::Edge<unsigned_int>_*,_ADS::ObjPointerComparator<ADS::Edge<unsigned_int>_>_>
                 ::pop(&this_00->edges);
      while (local_28 != (Edge<unsigned_int> *)0x0) {
        if (local_28 != (Edge<unsigned_int> *)0x0) {
          Edge<unsigned_int>::~Edge(local_28);
          operator_delete(local_28);
        }
        local_28 = LChain<ADS::Edge<unsigned_int>_*,_ADS::ObjPointerComparator<ADS::Edge<unsigned_int>_>_>
                   ::pop(&this_00->edges);
      }
    }
    if (this_00 != (Vertex<unsigned_int> *)0x0) {
      Vertex<unsigned_int>::~Vertex(this_00);
      operator_delete(this_00);
    }
  }
  this->_uiNVertexes = 0;
  this->_uiNEdges = 0;
  return;
}

Assistant:

void Graph<T>::empty()
    {
        for (unsigned int i = 0; i < _vertices.size(); i++) {
            Vertex<T> *pVertex = _vertices.remove (i);
            if (pVertex != NULL) {
                for (Edge<T> *pEdge = pVertex->edges.pop(); pEdge != NULL;
                     pEdge = pVertex->edges.pop())
                    delete pEdge;
            }
            delete pVertex;
        }
        _uiNVertexes = 0;
        _uiNEdges = 0;
    }